

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O0

void __thiscall wasm::ExecutionResults::printValue(ExecutionResults *this,Literal *value)

{
  Literal LVar1;
  Literal LVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  Literal *this_00;
  Type in_stack_ffffffffffffff08;
  bool local_d9;
  bool local_c9;
  Literal local_b8;
  Literal local_a0;
  HeapType local_88;
  Type local_80;
  Type type;
  HeapType local_60 [3];
  Literal local_48;
  HeapType local_30;
  Type local_28;
  Type local_20;
  Literal *local_18;
  Literal *value_local;
  ExecutionResults *this_local;
  
  local_20.id = (value->type).id;
  local_18 = value;
  value_local = (Literal *)this;
  HeapType::HeapType(&local_30,ext);
  Type::Type(&local_28,local_30,Nullable,Inexact);
  uVar4 = ::wasm::Type::isSubType(local_20,local_28);
  if (((uVar4 & 1) != 0) && (bVar3 = Type::isString(&value->type), !bVar3)) {
    ::wasm::Literal::internalize();
    ::wasm::Literal::operator=(value,&local_48);
    ::wasm::Literal::~Literal(&local_48);
  }
  bVar3 = Type::isRef(&value->type);
  local_c9 = false;
  if (bVar3) {
    local_60[0] = Type::getHeapType(&value->type);
    local_c9 = HeapType::isMaybeShared(local_60,any);
  }
  if (local_c9 != false) {
    ::wasm::Literal::externalize();
    ::wasm::Literal::operator=(value,(Literal *)&type);
    ::wasm::Literal::~Literal((Literal *)&type);
  }
  local_80.id = (value->type).id;
  bVar3 = Type::isRef(&local_80);
  if (bVar3) {
    bVar3 = Type::isString(&local_80);
    local_d9 = true;
    if (!bVar3) {
      local_88 = Type::getHeapType(&local_80);
      local_d9 = HeapType::isMaybeShared(&local_88,i31);
    }
    if (local_d9 == false) {
      bVar3 = wasm::Literal::isNull(value);
      if (bVar3) {
        std::operator<<((ostream *)&std::cout,"null\n");
      }
      else {
        bVar3 = Type::isFunction(&local_80);
        if (bVar3) {
          std::operator<<((ostream *)&std::cout,"function\n");
        }
        else {
          std::operator<<((ostream *)&std::cout,"object\n");
        }
      }
    }
    else {
      ::wasm::Literal::Literal(&local_a0,value);
      LVar1.field_0.func.super_IString.str._M_str = (char *)in_stack_ffffffffffffff00;
      LVar1.field_0.i64 = in_stack_fffffffffffffef8;
      LVar1.type.id = in_stack_ffffffffffffff08.id;
      poVar5 = (ostream *)::wasm::operator<<((ostream *)&std::cout,LVar1);
      std::operator<<(poVar5,'\n');
      ::wasm::Literal::~Literal(&local_a0);
    }
  }
  else {
    this_00 = &local_b8;
    ::wasm::Literal::Literal(this_00,value);
    LVar2.field_0.func.super_IString.str._M_str = (char *)this_00;
    LVar2.field_0.i64 = in_stack_fffffffffffffef8;
    LVar2.type.id = in_stack_ffffffffffffff08.id;
    poVar5 = (ostream *)::wasm::operator<<((ostream *)&std::cout,LVar2);
    std::operator<<(poVar5,'\n');
    ::wasm::Literal::~Literal(&local_b8);
  }
  return;
}

Assistant:

void printValue(Literal value) {
    // Unwrap an externalized GC value to get the actual value, but not strings,
    // which are normally a subtype of ext.
    if (Type::isSubType(value.type, Type(HeapType::ext, Nullable)) &&
        !value.type.isString()) {
      value = value.internalize();
    }

    // An anyref literal is a string.
    if (value.type.isRef() &&
        value.type.getHeapType().isMaybeShared(HeapType::any)) {
      value = value.externalize();
    }

    // Don't print most reference values, as e.g. funcref(N) contains an index,
    // which is not guaranteed to remain identical after optimizations. Do not
    // print the type in detail (as even that may change due to closed-world
    // optimizations); just print a simple type like JS does, 'object' or
    // 'function', but also print null for a null (so a null function does not
    // get printed as object, as in JS we have typeof null == 'object').
    //
    // The only references we print in full are strings and i31s, which have
    // simple and stable internal structures that optimizations will not alter.
    auto type = value.type;
    if (type.isRef()) {
      if (type.isString() || type.getHeapType().isMaybeShared(HeapType::i31)) {
        std::cout << value << '\n';
      } else if (value.isNull()) {
        std::cout << "null\n";
      } else if (type.isFunction()) {
        std::cout << "function\n";
      } else {
        std::cout << "object\n";
      }
      return;
    }

    // Non-references can be printed in full.
    std::cout << value << '\n';
  }